

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_scatter.cpp
# Opt level: O0

void duckdb::ScatterStringVector
               (UnifiedVectorFormat *col,Vector *rows,data_ptr_t *str_locations,SelectionVector *sel
               ,idx_t count,idx_t col_offset,idx_t col_no,idx_t col_count)

{
  bool bVar1;
  string_t *this;
  idx_t iVar2;
  SelectionVector *in_RCX;
  long in_RDX;
  UnifiedVectorFormat *in_RDI;
  ulong in_R8;
  long in_R9;
  string_t inserted;
  string_t *str;
  ValidityBytes col_mask;
  uchar *row;
  idx_t col_idx;
  idx_t idx;
  idx_t i;
  string_t null;
  uchar **ptrs;
  string_t *string_data;
  string_t *in_stack_ffffffffffffff30;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff38;
  TemplatedValidityMask<unsigned_char> *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  TemplatedValidityMask<unsigned_char> local_90;
  uchar *local_70;
  idx_t local_68;
  idx_t local_60;
  ulong local_58;
  string_t local_50;
  uchar **local_40;
  string_t *local_38;
  long local_30;
  ulong local_28;
  SelectionVector *local_20;
  long local_18;
  UnifiedVectorFormat *local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_38 = UnifiedVectorFormat::GetData<duckdb::string_t>(in_RDI);
  local_40 = FlatVector::GetData<unsigned_char*>((Vector *)0x1590b19);
  string_t::string_t((string_t *)in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,
                     (uint32_t)((ulong)in_stack_ffffffffffffff40 >> 0x20));
  for (local_58 = 0; local_58 < local_28; local_58 = local_58 + 1) {
    local_60 = SelectionVector::get_index(local_20,local_58);
    local_68 = SelectionVector::get_index(local_8->sel,local_60);
    local_70 = local_40[local_60];
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_ffffffffffffff38,(idx_t)in_stack_ffffffffffffff30);
    if (bVar1) {
      bVar1 = string_t::IsInlined((string_t *)0x1590c4e);
      if (bVar1) {
        Store<duckdb::string_t>(local_38 + local_68,local_70 + local_30);
      }
      else {
        this = local_38 + local_68;
        const_char_ptr_cast<unsigned_char>(*(uchar **)(local_18 + local_58 * 8));
        iVar2 = string_t::GetSize(this);
        UnsafeNumericCast<unsigned_int,unsigned_long,void>(iVar2);
        string_t::string_t((string_t *)in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,
                           (uint32_t)((ulong)in_stack_ffffffffffffff40 >> 0x20));
        in_stack_ffffffffffffff30 =
             (string_t *)string_t::GetDataWriteable(in_stack_ffffffffffffff30);
        in_stack_ffffffffffffff38 =
             (TemplatedValidityMask<unsigned_long> *)string_t::GetData(in_stack_ffffffffffffff30);
        iVar2 = string_t::GetSize(this);
        memcpy(in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,iVar2);
        iVar2 = string_t::GetSize(this);
        *(idx_t *)(local_18 + local_58 * 8) = iVar2 + *(long *)(local_18 + local_58 * 8);
        string_t::Finalize((string_t *)in_stack_ffffffffffffff40);
        Store<duckdb::string_t>((string_t *)&stack0xffffffffffffff48,local_70 + local_30);
      }
    }
    else {
      in_stack_ffffffffffffff40 = &local_90;
      TemplatedValidityMask<unsigned_char>::TemplatedValidityMask
                (in_stack_ffffffffffffff40,(uchar *)in_stack_ffffffffffffff38,
                 (idx_t)in_stack_ffffffffffffff30);
      TemplatedValidityMask<unsigned_char>::SetInvalidUnsafe
                (in_stack_ffffffffffffff40,(idx_t)in_stack_ffffffffffffff38);
      Store<duckdb::string_t>(&local_50,local_70 + local_30);
      TemplatedValidityMask<unsigned_char>::~TemplatedValidityMask
                ((TemplatedValidityMask<unsigned_char> *)0x1590c13);
    }
  }
  return;
}

Assistant:

static void ScatterStringVector(UnifiedVectorFormat &col, Vector &rows, data_ptr_t str_locations[],
                                const SelectionVector &sel, const idx_t count, const idx_t col_offset,
                                const idx_t col_no, const idx_t col_count) {
	auto string_data = UnifiedVectorFormat::GetData<string_t>(col);
	auto ptrs = FlatVector::GetData<data_ptr_t>(rows);

	// Write out zero length to avoid swizzling problems.
	const string_t null(nullptr, 0);
	for (idx_t i = 0; i < count; i++) {
		auto idx = sel.get_index(i);
		auto col_idx = col.sel->get_index(idx);
		auto row = ptrs[idx];
		if (!col.validity.RowIsValid(col_idx)) {
			ValidityBytes col_mask(row, col_count);
			col_mask.SetInvalidUnsafe(col_no);
			Store<string_t>(null, row + col_offset);
		} else if (string_data[col_idx].IsInlined()) {
			Store<string_t>(string_data[col_idx], row + col_offset);
		} else {
			const auto &str = string_data[col_idx];
			string_t inserted(const_char_ptr_cast(str_locations[i]), UnsafeNumericCast<uint32_t>(str.GetSize()));
			memcpy(inserted.GetDataWriteable(), str.GetData(), str.GetSize());
			str_locations[i] += str.GetSize();
			inserted.Finalize();
			Store<string_t>(inserted, row + col_offset);
		}
	}
}